

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

bool __thiscall
FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>
::hasFastAccess(FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>_>
                *this)

{
  bool bVar1;
  
  bVar1 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
          ::hasFastAccess(&this->left_->fadexpr_);
  if (bVar1) {
    bVar1 = FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
            ::hasFastAccess(&this->right_->fadexpr_);
    return bVar1;
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}